

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteSInt32
               (int field_number,int32 value,CodedOutputStream *output)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = field_number << 3;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar6);
    iVar3 = output->buffer_size_;
  }
  else {
    pbVar1 = output->buffer_;
    pbVar4 = pbVar1;
    uVar5 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar2);
    }
    *pbVar4 = (byte)uVar5;
    iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar3;
    iVar3 = output->buffer_size_ - iVar3;
    output->buffer_size_ = iVar3;
  }
  uVar6 = value >> 0x1f ^ value * 2;
  if (iVar3 < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar6);
    return;
  }
  pbVar1 = output->buffer_;
  pbVar4 = pbVar1;
  uVar5 = uVar6;
  if (0x7f < uVar6) {
    do {
      *pbVar4 = (byte)uVar6 | 0x80;
      uVar5 = uVar6 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar2 = 0x3fff < uVar6;
      uVar6 = uVar5;
    } while (bVar2);
  }
  *pbVar4 = (byte)uVar5;
  iVar3 = ((int)pbVar4 - (int)pbVar1) + 1;
  output->buffer_ = output->buffer_ + iVar3;
  output->buffer_size_ = output->buffer_size_ - iVar3;
  return;
}

Assistant:

void WireFormatLite::WriteSInt32(int field_number, int32 value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt32NoTag(value, output);
}